

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::SetCameraDirection(ON_Viewport *this,ON_3dVector *v)

{
  ON_3dVector candidate_vector;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ON_3dVector *v_local;
  ON_Viewport *this_local;
  
  if (((this->m_bLockCamDir & 1U) == 0) ||
     (uVar1 = (this->m_CamDir).y, uVar2 = (this->m_CamDir).z, candidate_vector.y = (double)uVar2,
     candidate_vector.x = (double)uVar1, candidate_vector.z = (double)this,
     bVar3 = IsValidCameraUpOrDirection(candidate_vector), !bVar3)) {
    bVar3 = ON_3dVector::operator==(v,&ON_3dVector::UnsetVector);
    if (bVar3) {
      (this->m_CamDir).x = ON_3dVector::UnsetVector.x;
      (this->m_CamDir).y = ON_3dVector::UnsetVector.y;
      (this->m_CamDir).z = ON_3dVector::UnsetVector.z;
      *(undefined8 *)(this->m_projection_content_sha1).m_digest =
           ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
      *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) =
           ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
      *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
           ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      this->m_bValidCameraFrame = false;
      this->m_bValidCamera = false;
    }
    else {
      (this->m_CamDir).x = v->x;
      (this->m_CamDir).y = v->y;
      (this->m_CamDir).z = v->z;
      SetCameraFrame(this);
    }
    this_local._7_1_ = (bool)(this->m_bValidCamera & 1);
  }
  else {
    this_local._7_1_ = ON_3dVector::operator==(v,&this->m_CamDir);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::SetCameraDirection( const ON_3dVector& v )
{
  if ( m_bLockCamDir && ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
  {
    return (v == m_CamDir);
  }

  if (v == ON_3dVector::UnsetVector)
  {
    m_CamDir = ON_3dVector::UnsetVector;
    m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;
    m_bValidCameraFrame = false;
    m_bValidCamera = false;
  }
  else
  {
    m_CamDir = v;
    SetCameraFrame();
  }

  return m_bValidCamera;
}